

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::SchemaElement::~SchemaElement(SchemaElement *this)

{
  ~SchemaElement(this);
  operator_delete(this);
  return;
}

Assistant:

SchemaElement::~SchemaElement() noexcept {
}